

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketFactory.cpp
# Opt level: O3

void __thiscall
gmlc::networking::SocketFactory::parse_json_config(SocketFactory *this,string *conf_str)

{
  bool bVar1;
  json j;
  data dStack_38;
  _Any_data local_28;
  code *local_18;
  undefined8 uStack_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_18 = (code *)0x0;
  uStack_10 = 0;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)&dStack_38,conf_str,(parser_callback_t *)&local_28,true,false);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  bVar1 = nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::value<bool_&,_const_char_(&)[10],_bool,_0>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&dStack_38,(char (*) [10])0x3d5025,&this->encrypted);
  this->encrypted = bVar1;
  nlohmann::json_abi_v3_11_3::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::data::~data(&dStack_38);
  return;
}

Assistant:

void SocketFactory::parse_json_config(std::string conf_str)
{
    json j = json::parse(conf_str);

    // parse SocketFactory settings; defaults to existing setting if option is
    // not present in the JSON file
    encrypted = j.value("encrypted", encrypted);
#ifdef GMLC_NETWORKING_ENABLE_ENCRYPTION
    password = j.value("password", password);
    use_default_verify_paths =
        j.value("use_default_verify_paths", use_default_verify_paths);
    verify_file = j.value("verify_file", verify_file);
    verify_path = j.value("verify_path", verify_path);
    certificate_chain_file =
        j.value("certificate_chain_file", certificate_chain_file);
    certificate_file = j.value("certificate_file", certificate_file);
    private_key_file = j.value("private_key_file", private_key_file);
    rsa_private_key_file =
        j.value("rsa_private_key_file", rsa_private_key_file);
    tmp_dh_file = j.value("tmp_dh_file", tmp_dh_file);
#endif
}